

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_upvaluejoin(lua_State *L,int fidx1,int n1,int fidx2,int n2)

{
  UpVal *v;
  UpVal **ppUVar1;
  UpVal **ppUVar2;
  LClosure *f1;
  LClosure *local_30;
  
  ppUVar1 = getupvalref(L,fidx1,n1,&local_30);
  ppUVar2 = getupvalref(L,fidx2,n2,(LClosure **)0x0);
  v = *ppUVar2;
  *ppUVar1 = v;
  if (((local_30->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)local_30,(GCObject *)v);
  }
  return;
}

Assistant:

LUA_API void lua_upvaluejoin (lua_State *L, int fidx1, int n1,
                                            int fidx2, int n2) {
  LClosure *f1;
  UpVal **up1 = getupvalref(L, fidx1, n1, &f1);
  UpVal **up2 = getupvalref(L, fidx2, n2, NULL);
  api_check(L, *up1 != NULL && *up2 != NULL, "invalid upvalue index");
  *up1 = *up2;
  luaC_objbarrier(L, f1, *up1);
}